

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O0

void DoFilter(VP8EncIterator *it,int level)

{
  long *plVar1;
  uint8_t *__dest;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  int in_ESI;
  long in_RDI;
  int hev_thresh;
  uint8_t *v_dst;
  uint8_t *u_dst;
  uint8_t *y_dst;
  int limit;
  int ilevel;
  VP8Encoder *enc;
  
  plVar1 = *(long **)(in_RDI + 0x28);
  iVar4 = GetILevel(*(int *)(*plVar1 + 0x24),in_ESI);
  iVar5 = in_ESI * 2 + iVar4;
  __dest = *(uint8_t **)(in_RDI + 0x18);
  puVar6 = (uint8_t *)(*(long *)(in_RDI + 0x18) + 0x10);
  puVar7 = (uint8_t *)(*(long *)(in_RDI + 0x18) + 0x18);
  memcpy(__dest,*(void **)(in_RDI + 0x10),0x200);
  if ((int)plVar1[2] == 1) {
    (*VP8SimpleHFilter16i)(__dest,0x20,iVar5);
    (*VP8SimpleVFilter16i)(__dest,0x20,iVar5);
  }
  else {
    if (in_ESI < 0x28) {
      uVar2 = 0xe < in_ESI;
    }
    else {
      uVar2 = 2;
    }
    iVar3 = (int)uVar2;
    (*VP8HFilter16i)(__dest,0x20,iVar5,iVar4,iVar3);
    (*VP8HFilter8i)(puVar6,puVar7,0x20,iVar5,iVar4,iVar3);
    (*VP8VFilter16i)(__dest,0x20,iVar5,iVar4,iVar3);
    (*VP8VFilter8i)(puVar6,puVar7,0x20,iVar5,iVar4,iVar3);
  }
  return;
}

Assistant:

static void DoFilter(const VP8EncIterator* const it, int level) {
  const VP8Encoder* const enc = it->enc;
  const int ilevel = GetILevel(enc->config->filter_sharpness, level);
  const int limit = 2 * level + ilevel;

  uint8_t* const y_dst = it->yuv_out2 + Y_OFF_ENC;
  uint8_t* const u_dst = it->yuv_out2 + U_OFF_ENC;
  uint8_t* const v_dst = it->yuv_out2 + V_OFF_ENC;

  // copy current block to yuv_out2
  memcpy(y_dst, it->yuv_out, YUV_SIZE_ENC * sizeof(uint8_t));

  if (enc->filter_hdr.simple == 1) {   // simple
    VP8SimpleHFilter16i(y_dst, BPS, limit);
    VP8SimpleVFilter16i(y_dst, BPS, limit);
  } else {    // complex
    const int hev_thresh = (level >= 40) ? 2 : (level >= 15) ? 1 : 0;
    VP8HFilter16i(y_dst, BPS, limit, ilevel, hev_thresh);
    VP8HFilter8i(u_dst, v_dst, BPS, limit, ilevel, hev_thresh);
    VP8VFilter16i(y_dst, BPS, limit, ilevel, hev_thresh);
    VP8VFilter8i(u_dst, v_dst, BPS, limit, ilevel, hev_thresh);
  }
}